

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int listcode(lua_State *L)

{
  int iVar1;
  char *s;
  char local_88 [8];
  char buff [100];
  Proto *p;
  int pc;
  lua_State *L_local;
  
  iVar1 = lua_type(L,1);
  if (iVar1 == 6) {
    iVar1 = lua_iscfunction(L,1);
    if (iVar1 == 0) goto LAB_00166050;
  }
  luaL_argerror(L,1,"Lua function expected");
LAB_00166050:
  if (L->ci->func[1].tt_ != 0x8006) {
    __assert_fail("(((((L->ci->func + (1))))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                  ,0x265,"int listcode(lua_State *)");
  }
  if ((L->ci->func[1].value_.gc)->tt == '\x06') {
    unique0x00012000 = *(Proto **)(L->ci->func[1].value_.f + 0x18);
    lua_createtable(L,0,0);
    setnameval(L,"maxstack",(uint)stack0xffffffffffffffe0->maxstacksize);
    setnameval(L,"numparams",(uint)stack0xffffffffffffffe0->numparams);
    for (p._4_4_ = 0; p._4_4_ < stack0xffffffffffffffe0->sizecode; p._4_4_ = p._4_4_ + 1) {
      lua_pushinteger(L,(long)(p._4_4_ + 1));
      s = buildop(stack0xffffffffffffffe0,p._4_4_,local_88);
      lua_pushstring(L,s);
      lua_settable(L,-3);
    }
    return 1;
  }
  __assert_fail("((((L->ci->func + (1)))->value_).gc)->tt == ((6) | ((0) << 4))",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                ,0x265,"int listcode(lua_State *)");
}

Assistant:

static int listcode (lua_State *L) {
  int pc;
  Proto *p;
  luaL_argcheck(L, lua_isfunction(L, 1) && !lua_iscfunction(L, 1),
                 1, "Lua function expected");
  p = getproto(obj_at(L, 1));
  lua_newtable(L);
  setnameval(L, "maxstack", p->maxstacksize);
  setnameval(L, "numparams", p->numparams);
  for (pc=0; pc<p->sizecode; pc++) {
    char buff[100];
    lua_pushinteger(L, pc+1);
    lua_pushstring(L, buildop(p, pc, buff));
    lua_settable(L, -3);
  }
  return 1;
}